

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * __thiscall
Mustache::QtVariantContext::eval
          (QString *__return_storage_ptr__,QtVariantContext *this,QString *key,QString *_template,
          Renderer *renderer)

{
  char cVar1;
  QVariant fn;
  function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)> fStack_68;
  QVariant local_48;
  
  value(&local_48,this,key);
  cVar1 = ::QVariant::isNull();
  if (cVar1 == '\0') {
    qvariant_cast<std::function<QString(QString_const&,Mustache::Renderer*,Mustache::Context*)>>
              (&fStack_68,&local_48);
    std::function<QString_(const_QString_&,_Mustache::Renderer_*,_Mustache::Context_*)>::operator()
              (__return_storage_ptr__,&fStack_68,_template,renderer,&this->super_Context);
    std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  ::QVariant::~QVariant(&local_48);
  return __return_storage_ptr__;
}

Assistant:

QString QtVariantContext::eval(const QString& key, const QString& _template, Renderer* renderer)
{
	QVariant fn = value(key);
	if (fn.isNull()) {
		return QString();
	}
	return fn.value<fn_t>()(_template, renderer, this);
}